

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

void uv__udp_sendmsg(uv_udp_t *handle)

{
  void **ppvVar1;
  short sVar2;
  undefined8 *puVar3;
  int iVar4;
  long *plVar5;
  int *piVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  socklen_t sVar10;
  ulong uVar11;
  uv__mmsghdr local_538 [20];
  
  uv_once(&once,uv__udp_mmsg_init);
  if (uv__sendmmsg_avail == '\0') {
    while (plVar5 = (long *)handle->write_queue[0], handle->write_queue != (void **)plVar5) {
      if (plVar5 == (long *)0x0) {
        __assert_fail("q != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                      ,0x1ae,"void uv__udp_sendmsg(uv_udp_t *)");
      }
      local_538[0].msg_hdr.msg_control = (void *)0x0;
      local_538[0].msg_hdr.msg_controllen = 0;
      local_538[0].msg_hdr.msg_flags = 0;
      local_538[0].msg_hdr._52_4_ = 0;
      local_538[0].msg_hdr.msg_iov = (iovec *)0x0;
      local_538[0].msg_hdr.msg_iovlen = 0;
      local_538[0].msg_hdr.msg_name = (long *)0x0;
      local_538[0].msg_hdr._8_8_ = 0;
      sVar2 = (short)plVar5[2];
      if (sVar2 != 0) {
        local_538[0].msg_hdr.msg_name = plVar5 + 2;
        if (sVar2 == 1) {
          uVar8 = 0x6e;
        }
        else {
          uVar8 = 0x1c;
          if (sVar2 != 10) {
            if (sVar2 != 2) {
              __assert_fail("0 && \"unsupported address family\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                            ,0x1c0,"void uv__udp_sendmsg(uv_udp_t *)");
            }
            uVar8 = 0x10;
          }
        }
        local_538[0].msg_hdr._12_4_ = 0;
        local_538[0].msg_hdr.msg_namelen = uVar8;
      }
      local_538[0].msg_hdr.msg_iov = (iovec *)plVar5[0x13];
      local_538[0].msg_hdr.msg_iovlen = (size_t)*(uint *)(plVar5 + 0x12);
      do {
        lVar7 = sendmsg((handle->io_watcher).fd,(msghdr *)local_538,0);
        if (lVar7 != -1) goto LAB_006f6025;
        piVar6 = __errno_location();
        iVar4 = *piVar6;
      } while ((long)iVar4 == 4);
      if (iVar4 == 0xb) {
        return;
      }
      if (iVar4 == 0x69) {
        return;
      }
      lVar7 = -(long)iVar4;
LAB_006f6025:
      plVar5[0x14] = lVar7;
      lVar7 = *plVar5;
      *(long *)plVar5[1] = lVar7;
      *(long *)(lVar7 + 8) = plVar5[1];
      *plVar5 = (long)handle->write_completed_queue;
      puVar3 = (undefined8 *)handle->write_completed_queue[1];
      plVar5[1] = (long)puVar3;
      *puVar3 = plVar5;
      handle->write_completed_queue[1] = plVar5;
      uv__io_feed(handle->loop,&handle->io_watcher);
    }
  }
  else {
    ppvVar1 = handle->write_queue;
    plVar5 = (long *)handle->write_queue[0];
    if (ppvVar1 != (void **)plVar5) {
      uVar11 = 0;
      while( true ) {
        for (; uVar11 < 0x14 && (void **)plVar5 != ppvVar1; uVar11 = uVar11 + 1) {
          if (plVar5 == (long *)0x0) {
            __assert_fail("q != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                          ,0x151,"void uv__udp_sendmmsg(uv_udp_t *)");
          }
          *(undefined8 *)&local_538[uVar11].msg_hdr.msg_flags = 0;
          *(undefined8 *)&local_538[uVar11].msg_len = 0;
          local_538[uVar11].msg_hdr.msg_control = (void *)0x0;
          local_538[uVar11].msg_hdr.msg_controllen = 0;
          local_538[uVar11].msg_hdr.msg_iov = (iovec *)0x0;
          local_538[uVar11].msg_hdr.msg_iovlen = 0;
          local_538[uVar11].msg_hdr.msg_name = (void *)0x0;
          *(undefined8 *)&local_538[uVar11].msg_hdr.msg_namelen = 0;
          sVar2 = (short)plVar5[2];
          if (sVar2 != 0) {
            local_538[uVar11].msg_hdr.msg_name = plVar5 + 2;
            if (sVar2 == 1) {
              sVar10 = 0x6e;
            }
            else {
              sVar10 = 0x1c;
              if (sVar2 != 10) {
                if (sVar2 != 2) {
                  __assert_fail("0 && \"unsupported address family\"",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                                ,0x163,"void uv__udp_sendmmsg(uv_udp_t *)");
                }
                sVar10 = 0x10;
              }
            }
            local_538[uVar11].msg_hdr.msg_namelen = sVar10;
          }
          local_538[uVar11].msg_hdr.msg_iov = (iovec *)plVar5[0x13];
          local_538[uVar11].msg_hdr.msg_iovlen = (ulong)*(uint *)(plVar5 + 0x12);
          plVar5 = (long *)*plVar5;
        }
        while (iVar4 = uv__sendmmsg((handle->io_watcher).fd,local_538,(uint)uVar11), iVar4 == -1) {
          piVar6 = __errno_location();
          iVar4 = *piVar6;
          if (iVar4 != 4) goto LAB_006f6070;
        }
        if (iVar4 < 1) break;
        uVar11 = 0;
        while ((plVar5 = (long *)*ppvVar1, uVar11 < (ulong)(long)iVar4 &&
               ((void **)plVar5 != ppvVar1))) {
          if (plVar5 == (long *)0x0) {
            __assert_fail("q != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                          ,0x187,"void uv__udp_sendmmsg(uv_udp_t *)");
          }
          plVar5[0x14] = *(long *)(plVar5[0x13] + 8);
          lVar7 = *plVar5;
          *(long *)plVar5[1] = lVar7;
          *(long *)(lVar7 + 8) = plVar5[1];
          *plVar5 = (long)handle->write_completed_queue;
          puVar3 = (undefined8 *)handle->write_completed_queue[1];
          plVar5[1] = (long)puVar3;
          *puVar3 = plVar5;
          handle->write_completed_queue[1] = plVar5;
          uVar11 = uVar11 + 1;
        }
        uVar11 = 0;
        if (ppvVar1 == (void **)plVar5) goto LAB_006f60c9;
      }
      piVar6 = __errno_location();
      iVar4 = *piVar6;
LAB_006f6070:
      if (iVar4 == 0xb) {
        return;
      }
      if (iVar4 == 0x69) {
        return;
      }
      uVar9 = 0;
      while ((uVar9 < uVar11 && (plVar5 = (long *)*ppvVar1, (void **)plVar5 != ppvVar1))) {
        if (plVar5 == (long *)0x0) {
          __assert_fail("q != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                        ,0x175,"void uv__udp_sendmmsg(uv_udp_t *)");
        }
        plVar5[0x14] = (long)-iVar4;
        lVar7 = *plVar5;
        *(long *)plVar5[1] = lVar7;
        *(long *)(lVar7 + 8) = plVar5[1];
        *plVar5 = (long)handle->write_completed_queue;
        puVar3 = (undefined8 *)handle->write_completed_queue[1];
        plVar5[1] = (long)puVar3;
        *puVar3 = plVar5;
        handle->write_completed_queue[1] = plVar5;
        uVar9 = uVar9 + 1;
      }
LAB_006f60c9:
      uv__io_feed(handle->loop,&handle->io_watcher);
    }
  }
  return;
}

Assistant:

static void uv__udp_sendmsg(uv_udp_t* handle) {
  uv_udp_send_t* req;
  struct msghdr h;
  QUEUE* q;
  ssize_t size;

#if HAVE_MMSG
  uv_once(&once, uv__udp_mmsg_init);
  if (uv__sendmmsg_avail) {
    uv__udp_sendmmsg(handle);
    return;
  }
#endif

  while (!QUEUE_EMPTY(&handle->write_queue)) {
    q = QUEUE_HEAD(&handle->write_queue);
    assert(q != NULL);

    req = QUEUE_DATA(q, uv_udp_send_t, queue);
    assert(req != NULL);

    memset(&h, 0, sizeof h);
    if (req->addr.ss_family == AF_UNSPEC) {
      h.msg_name = NULL;
      h.msg_namelen = 0;
    } else {
      h.msg_name = &req->addr;
      if (req->addr.ss_family == AF_INET6)
        h.msg_namelen = sizeof(struct sockaddr_in6);
      else if (req->addr.ss_family == AF_INET)
        h.msg_namelen = sizeof(struct sockaddr_in);
      else if (req->addr.ss_family == AF_UNIX)
        h.msg_namelen = sizeof(struct sockaddr_un);
      else {
        assert(0 && "unsupported address family");
        abort();
      }
    }
    h.msg_iov = (struct iovec*) req->bufs;
    h.msg_iovlen = req->nbufs;

    do {
      size = sendmsg(handle->io_watcher.fd, &h, 0);
    } while (size == -1 && errno == EINTR);

    if (size == -1) {
      if (errno == EAGAIN || errno == EWOULDBLOCK || errno == ENOBUFS)
        break;
    }

    req->status = (size == -1 ? UV__ERR(errno) : size);

    /* Sending a datagram is an atomic operation: either all data
     * is written or nothing is (and EMSGSIZE is raised). That is
     * why we don't handle partial writes. Just pop the request
     * off the write queue and onto the completed queue, done.
     */
    QUEUE_REMOVE(&req->queue);
    QUEUE_INSERT_TAIL(&handle->write_completed_queue, &req->queue);
    uv__io_feed(handle->loop, &handle->io_watcher);
  }
}